

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_kernel xmrig::OclLib::createKernel(cl_program program,char *kernel_name)

{
  cl_kernel p_Var1;
  runtime_error *this;
  char *pcVar2;
  cl_kernel kernel;
  cl_int ret;
  cl_int *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  cl_int in_stack_ffffffffffffffec;
  
  p_Var1 = createKernel((cl_program)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (in_stack_ffffffffffffffec != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar2 = OclError::toString(in_stack_ffffffffffffffec);
    std::runtime_error::runtime_error(this,pcVar2);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return p_Var1;
}

Assistant:

cl_kernel xmrig::OclLib::createKernel(cl_program program, const char *kernel_name)
{
    cl_int ret;
    cl_kernel kernel = createKernel(program, kernel_name, &ret);
    if (ret != CL_SUCCESS) {
        throw std::runtime_error(OclError::toString(ret));
    }

    return kernel;
}